

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O3

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* wasm::DFA::Internal::refinePartitionsImpl
            (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *__return_storage_ptr__,InputGraph *inputGraph)

{
  size_t sVar1;
  pointer *this;
  long *plVar2;
  pointer pvVar3;
  pointer pvVar4;
  ulong *puVar5;
  size_t *psVar6;
  iterator __position;
  _Base_ptr p_Var7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  pointer puVar12;
  pointer puVar13;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *partition;
  pointer pvVar14;
  Partitions *pPVar15;
  Partitions *pPVar16;
  Partitions *pPVar17;
  Partitions *pPVar18;
  pointer puVar19;
  pointer pTVar20;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar21;
  pointer __dest;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  _Rb_tree_node_base *p_Var22;
  pointer puVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  _Base_ptr p_Var27;
  InputGraph *__range2;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar28;
  pointer pvVar29;
  Partitions *pPVar30;
  Partitions *pPVar31;
  _Link_type __x;
  unsigned_long uVar32;
  unsigned_long uVar33;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *partition_1;
  pointer pvVar34;
  pointer __old_finish;
  size_t sVar35;
  ulong *puVar36;
  _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  *p_Var37;
  long *plVar38;
  undefined1 auVar39 [8];
  size_t sVar40;
  pointer __dest_00;
  long lVar41;
  bool bVar42;
  size_t local_260;
  size_t newSplitter;
  undefined1 local_250 [8];
  Set splitter;
  Partitions partitions;
  Partitions splitters;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *resultPartitions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> potentialSplitters;
  undefined1 auStack_b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> transitionIndices;
  undefined1 auStack_98 [8];
  Set partition_2;
  Partitions *local_78;
  size_t *psStack_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> markedPartitions;
  unsigned_long local_48;
  pointer local_40;
  
  pvVar14 = (inputGraph->
            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (inputGraph->
           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar14 == pvVar3) {
    sVar35 = 0;
    local_78 = (Partitions *)0x0;
  }
  else {
    local_78 = (Partitions *)0x0;
    sVar35 = 0;
    do {
      pvVar29 = (pvVar14->
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (pvVar14->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar26 = (long)pvVar4 - (long)pvVar29;
      if (lVar26 != 0) {
        do {
          sVar35 = sVar35 + ((long)(pvVar29->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar29->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3);
          pvVar29 = pvVar29 + 1;
        } while (pvVar29 != pvVar4);
      }
      local_78 = (Partitions *)((long)local_78 + (lVar26 >> 3) * -0x5555555555555555);
      pvVar14 = pvVar14 + 1;
    } while (pvVar14 != pvVar3);
  }
  pPVar30 = local_78;
  anon_unknown_0::Partitions::Partitions((Partitions *)&splitter.index,(size_t)local_78);
  pvVar14 = (inputGraph->
            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (inputGraph->
           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar14 != pvVar3) {
    uVar32 = 0;
    pvVar34 = pvVar14;
    do {
      sVar1 = splitter.index + 1;
      partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage[splitter.index] = uVar32;
      partitions.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[splitter.index] = uVar32;
      lVar26 = (long)(pvVar34->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar34->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      uVar33 = uVar32;
      if (lVar26 != 0) {
        lVar26 = (lVar26 >> 3) * -0x5555555555555555;
        lVar26 = lVar26 + (ulong)(lVar26 == 0);
        uVar33 = lVar26 + uVar32;
        do {
          *(unsigned_long *)(partitions.sets + uVar32 * 8) = uVar32;
          partitions.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[uVar32] = uVar32;
          partitions.elementIndices.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[uVar32] = splitter.index;
          uVar32 = uVar32 + 1;
          lVar26 = lVar26 + -1;
        } while (lVar26 != 0);
      }
      partitions.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage[splitter.index] = uVar33;
      pvVar34 = pvVar34 + 1;
      pPVar30 = (Partitions *)partitions.sets;
      uVar32 = uVar33;
      splitter.index = sVar1;
    } while (pvVar34 != pvVar3);
  }
  auStack_b8 = (undefined1  [8])0x0;
  transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  splitters.sets._0_4_ = 0;
  splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = &splitters.sets;
  splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &splitters.sets;
  splitters.elementIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  newSplitter = sVar35;
  if (pvVar14 != pvVar3) {
    local_48 = 0;
    do {
      pvVar4 = (pvVar14->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar29 = (pvVar14->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pvVar29 != pvVar4;
          pvVar29 = pvVar29 + 1) {
        puVar36 = (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar5 = (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar36 != puVar5) {
          uVar32 = 0;
          do {
            bVar42 = true;
            if (splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
              pPVar18 = &splitters;
LAB_00c28807:
              pPVar15 = (Partitions *)operator_new(0x40);
              puVar23 = (pointer)*puVar36;
              (pPVar15->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = puVar23;
              (pPVar15->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (pPVar15->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (pPVar15->setIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              pPVar31 = (Partitions *)
                        splitters.elements.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              if (bVar42) {
                if ((splitters.elementIndices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start == (pointer)0x0) ||
                   (puVar23 <=
                    (pointer)splitters.elements.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage[4])) {
LAB_00c288ca:
                  pPVar31 = &splitters;
                  pPVar18 = (Partitions *)
                            splitters.elements.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  if (splitters.elements.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start == (pointer)0x0) {
LAB_00c288fe:
                    if (pPVar31 ==
                        (Partitions *)
                        splitters.elements.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish) goto LAB_00c2891b;
                    pPVar18 = (Partitions *)std::_Rb_tree_decrement((_Rb_tree_node_base *)pPVar31);
                    puVar19 = (pPVar18->elementIndices).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  }
                  else {
                    do {
                      pPVar31 = pPVar18;
                      puVar19 = (pPVar31->elementIndices).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      pPVar18 = (Partitions *)
                                (&(pPVar31->elements).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish)[puVar19 <= puVar23];
                    } while (pPVar18 != (Partitions *)0x0);
                    pPVar18 = pPVar31;
                    if (puVar23 < puVar19) goto LAB_00c288fe;
                  }
                  if (puVar23 <= puVar19) {
LAB_00c28964:
                    std::
                    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                    ::_M_drop_node((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                                    *)pPVar15,(_Link_type)pPVar30);
                    goto LAB_00c28976;
                  }
                }
LAB_00c2891b:
                pPVar17 = (Partitions *)0x0;
              }
              else {
                puVar19 = (pPVar18->elementIndices).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (puVar23 < puVar19) {
                  pPVar17 = (Partitions *)
                            splitters.elements.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  pPVar31 = (Partitions *)
                            splitters.elements.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  if ((Partitions *)
                      splitters.elements.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish == pPVar18) {
LAB_00c2895c:
                    pPVar18 = pPVar17;
                    if (pPVar31 == (Partitions *)0x0) goto LAB_00c28964;
                  }
                  else {
                    pPVar16 = (Partitions *)std::_Rb_tree_decrement((_Rb_tree_node_base *)pPVar18);
                    if (puVar23 <=
                        (pPVar16->elementIndices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start) goto LAB_00c288ca;
                    pPVar17 = pPVar18;
                    pPVar31 = pPVar18;
                    if ((pPVar16->elements).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                      pPVar17 = (Partitions *)0x0;
                      pPVar31 = pPVar16;
                    }
                  }
                }
                else {
                  if (puVar23 <= puVar19) goto LAB_00c28964;
                  if ((Partitions *)
                      splitters.elements.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == pPVar18) {
                    pPVar17 = (Partitions *)0x0;
                    goto LAB_00c2895c;
                  }
                  pPVar17 = (Partitions *)std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar18);
                  if ((pPVar17->elementIndices).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start <= puVar23) goto LAB_00c288ca;
                  pPVar31 = pPVar17;
                  if ((pPVar18->elements).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                    pPVar17 = (Partitions *)0x0;
                    pPVar31 = pPVar18;
                  }
                }
              }
              bVar42 = true;
              if ((pPVar17 == (Partitions *)0x0) && (&splitters != pPVar31)) {
                bVar42 = puVar23 < (pPVar31->elementIndices).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
              }
              pPVar30 = pPVar15;
              std::_Rb_tree_insert_and_rebalance
                        (bVar42,(_Rb_tree_node_base *)pPVar15,(_Rb_tree_node_base *)pPVar31,
                         (_Rb_tree_node_base *)&splitters);
              splitters.elementIndices.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((long)splitters.elementIndices.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
              pPVar18 = pPVar15;
            }
            else {
              pPVar31 = (Partitions *)*puVar36;
              pPVar15 = (Partitions *)
                        splitters.elements.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pPVar18 = &splitters;
              do {
                pPVar16 = pPVar18;
                pPVar17 = pPVar15;
                pPVar30 = (Partitions *)
                          (pPVar17->elementIndices).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pPVar18 = pPVar17;
                if (pPVar30 < pPVar31) {
                  pPVar18 = pPVar16;
                }
                pPVar15 = (Partitions *)
                          (&(pPVar17->elements).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish)[pPVar30 < pPVar31];
              } while (pPVar15 != (Partitions *)0x0);
              if (pPVar18 == &splitters) goto LAB_00c28807;
              if (pPVar30 < pPVar31) {
                pPVar17 = pPVar16;
              }
              if (pPVar31 < (Partitions *)
                            (pPVar17->elementIndices).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start) {
                bVar42 = false;
                goto LAB_00c28807;
              }
            }
LAB_00c28976:
            puVar23 = (pPVar18->elementIndices).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            if (puVar23 ==
                (pPVar18->setIndices).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
              splitters.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = puVar36;
              pPVar31 = (Partitions *)
                        (pPVar18->elementIndices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              sVar40 = (long)puVar23 - (long)pPVar31;
              if (sVar40 == 0x7ffffffffffffff0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar25 = (long)sVar40 >> 4;
              uVar24 = uVar25 + (uVar25 == 0);
              p_Var37 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                         *)(uVar24 + uVar25);
              if ((_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                   *)0x7fffffffffffffe < p_Var37) {
                p_Var37 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                           *)0x7ffffffffffffff;
              }
              if (CARRY8(uVar24,uVar25)) {
                p_Var37 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                           *)0x7ffffffffffffff;
              }
              pTVar20 = std::
                        _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                        ::_M_allocate(p_Var37,(size_t)pPVar30);
              *(unsigned_long *)((long)pTVar20 + sVar40) = local_48;
              *(unsigned_long *)((long)pTVar20 + sVar40 + 8) = uVar32;
              if (0 < (long)sVar40) {
                pPVar30 = pPVar31;
                memmove(pTVar20,pPVar31,sVar40);
              }
              if (pPVar31 != (Partitions *)0x0) {
                pPVar30 = (Partitions *)
                          ((long)(pPVar18->setIndices).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start - (long)pPVar31);
                operator_delete(pPVar31,(ulong)pPVar30);
              }
              (pPVar18->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = &pTVar20->pred;
              (pPVar18->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)((long)pTVar20 + sVar40 + 0x10);
              (pPVar18->setIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = &pTVar20[(long)p_Var37].pred;
              puVar36 = splitters.pivots.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *puVar23 = local_48;
              puVar23[1] = uVar32;
              (pPVar18->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = puVar23 + 2;
            }
            uVar32 = uVar32 + 1;
            puVar36 = puVar36 + 1;
          } while (puVar36 != puVar5);
        }
        local_48 = local_48 + 1;
      }
      pvVar14 = pvVar14 + 1;
    } while (pvVar14 != pvVar3);
  }
  sVar35 = newSplitter;
  if (0x7ffffffffffffff < newSplitter) {
    std::__throw_length_error("vector::reserve");
  }
  if (newSplitter == 0) {
    local_40 = (pointer)0x0;
    pTVar20 = (pointer)0x0;
  }
  else {
    pTVar20 = std::
              _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
              ::_M_allocate((_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                             *)newSplitter,(size_t)pPVar30);
    local_40 = pTVar20 + sVar35;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_b8,
             (size_type)((long)&local_78->sets + 1));
  __dest_00 = pTVar20;
  if (local_78 != (Partitions *)0x0) {
    pPVar30 = (Partitions *)0x0;
    do {
      sVar40 = (long)__dest_00 - (long)pTVar20;
      pvVar28 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)((long)sVar40 >> 4);
      resultPartitions = pvVar28;
      if (transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_b8,
                   (iterator)
                   transitionIndices.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,(unsigned_long *)&resultPartitions);
      }
      else {
        *transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_start = (unsigned_long)pvVar28;
        transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      if (splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pPVar31 = &splitters;
        pPVar18 = (Partitions *)
                  splitters.elements.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          pPVar17 = pPVar18;
          pPVar16 = pPVar31;
          pPVar15 = (Partitions *)
                    (pPVar17->elementIndices).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pPVar31 = pPVar17;
          if (pPVar15 < pPVar30) {
            pPVar31 = pPVar16;
          }
          pPVar18 = (Partitions *)
                    (&(pPVar17->elements).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish)[pPVar15 < pPVar30];
        } while (pPVar18 != (Partitions *)0x0);
        if (pPVar31 != &splitters) {
          pPVar18 = pPVar17;
          if (pPVar15 < pPVar30) {
            pPVar18 = pPVar16;
          }
          if ((Partitions *)
              (pPVar18->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start <= pPVar30) {
            if (pPVar15 < pPVar30) {
              pPVar17 = pPVar16;
            }
            puVar23 = (pPVar17->elementIndices).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            puVar19 = (pPVar17->elementIndices).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            if (puVar23 != puVar19) {
              uVar25 = (long)puVar19 - (long)puVar23;
              if ((ulong)((long)local_40 - (long)__dest_00) < uVar25) {
                pvVar21 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)((long)uVar25 >> 4);
                if ((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)(0x7ffffffffffffffU - (long)pvVar28) < pvVar21) {
                  std::__throw_length_error("vector::_M_range_insert");
                }
                if (pvVar21 < pvVar28) {
                  pvVar21 = pvVar28;
                }
                p_Var37 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                           *)((long)&(pvVar21->
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start +
                             (long)&(pvVar28->
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
                if ((_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                     *)0x7fffffffffffffe < p_Var37) {
                  p_Var37 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                             *)0x7ffffffffffffff;
                }
                if (CARRY8((ulong)pvVar21,(ulong)pvVar28)) {
                  p_Var37 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                             *)0x7ffffffffffffff;
                }
                __dest = std::
                         _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                         ::_M_allocate(p_Var37,(size_t)puVar23);
                if (pTVar20 != __dest_00) {
                  memmove(__dest,pTVar20,sVar40);
                }
                memcpy((void *)(sVar40 + (long)__dest),puVar23,uVar25);
                if (pTVar20 != (pointer)0x0) {
                  operator_delete(pTVar20,(long)local_40 - (long)pTVar20);
                }
                __dest_00 = (pointer)((long)(sVar40 + (long)__dest) + uVar25);
                local_40 = __dest + (long)p_Var37;
                pTVar20 = __dest;
              }
              else {
                memmove(__dest_00,puVar23,uVar25);
                __dest_00 = (pointer)((long)__dest_00 + uVar25);
              }
            }
          }
        }
      }
      pPVar30 = (Partitions *)((long)&pPVar30->sets + 1);
    } while (pPVar30 != local_78);
  }
  pvVar28 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)((long)__dest_00 - (long)pTVar20 >> 4);
  resultPartitions = pvVar28;
  if (transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __x = (_Link_type)
          transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_b8,
               (iterator)
               transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)&resultPartitions);
  }
  else {
    *transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start = (unsigned_long)pvVar28;
    __x = (_Link_type)
          (transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 1);
    transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)__x;
  }
  this = &partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
  ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
              *)splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start,__x);
  anon_unknown_0::Partitions::Partitions((Partitions *)this,(size_t)pvVar28);
  if (splitter.index != 0) {
    uVar32 = 0;
    uVar25 = 0;
    do {
      potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)potentialSplitters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&potentialSplitters;
      if (partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[uVar25] !=
          partitions.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[uVar25]) {
        plVar2 = (long *)(partitions.sets +
                         partitions.beginnings.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[uVar25] * 8);
        plVar38 = (long *)(partitions.sets +
                          partitions.setIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage[uVar25] * 8);
        do {
          psVar6 = *(size_t **)((long)auStack_b8 + (*plVar38 + 1) * 8);
          for (psStack_68 = *(size_t **)((long)auStack_b8 + *plVar38 * 8);
              puVar13 = splitters.endings.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
              puVar12 = splitters.setIndices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
              puVar19 = splitters.elementIndices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
              puVar23 = splitters.elements.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage, psStack_68 < psVar6;
              psStack_68 = (size_t *)((long)psStack_68 + 1)) {
            this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      std::
                      map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ::operator[]((map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                    *)&resultPartitions,&pTVar20[(long)psStack_68].label);
            __position._M_current = *(unsigned_long **)(this_00 + 8);
            if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        (this_00,__position,(unsigned_long *)&psStack_68);
            }
            else {
              *__position._M_current = (unsigned_long)psStack_68;
              *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          plVar38 = plVar38 + 1;
        } while (plVar38 != plVar2);
        if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != &potentialSplitters) {
          splitters.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               splitters.beginnings.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          lVar26 = CONCAT44(splitters.sets._4_4_,(undefined4)splitters.sets);
          p_Var22 = (_Rb_tree_node_base *)
                    potentialSplitters.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          do {
            puVar12[(long)partitions.pivots.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage] = uVar32;
            puVar13[(long)partitions.pivots.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage] = uVar32;
            p_Var7 = p_Var22[1]._M_left;
            for (p_Var27 = p_Var22[1]._M_parent; p_Var27 != p_Var7;
                p_Var27 = (_Base_ptr)&p_Var27->_M_parent) {
              lVar41 = *(long *)p_Var27;
              *(long *)(lVar26 + uVar32 * 8) = lVar41;
              puVar23[lVar41] = uVar32;
              puVar19[lVar41] =
                   (unsigned_long)
                   partitions.pivots.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              uVar32 = uVar32 + 1;
            }
            splitters.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage
            [(long)partitions.pivots.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage] = uVar32;
            partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)partitions.pivots.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
          } while (p_Var22 != (_Rb_tree_node_base *)&potentialSplitters);
        }
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)&resultPartitions);
      uVar25 = uVar25 + 1;
    } while (uVar25 < splitter.index);
  }
  resultPartitions =
       (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        *)0x0;
  potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&resultPartitions,
             (size_type)
             partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  psStack_68 = (size_t *)0x0;
  if (partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    do {
      if (potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&resultPartitions,
                   (iterator)
                   potentialSplitters.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,(unsigned_long *)&psStack_68);
      }
      else {
        *potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start = (unsigned_long)psStack_68;
        potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start =
             potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      psStack_68 = (size_t *)((long)psStack_68 + 1);
    } while (psStack_68 <
             partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  while (resultPartitions !=
         (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    puVar23 = potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start + -1;
    potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start + -1;
    psStack_68 = (size_t *)0x0;
    markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar32 = splitters.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage[*puVar23];
    if (splitters.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[*puVar23] != uVar32) {
      lVar26 = CONCAT44(splitters.sets._4_4_,(undefined4)splitters.sets);
      lVar41 = splitters.setIndices.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[*puVar23] << 3;
      puVar23 = partitions.elementIndices.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      puVar19 = partitions.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        sVar35 = pTVar20[*(long *)(lVar26 + lVar41)].pred;
        partition_2.partitions = (Partitions *)puVar23[sVar35];
        auStack_98 = (undefined1  [8])&splitter.index;
        if (puVar19[(long)partition_2.partitions] ==
            partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[(long)partition_2.partitions]) {
          if (markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&psStack_68,
                       (iterator)
                       markedPartitions.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,(unsigned_long *)&partition_2);
            puVar23 = partitions.elementIndices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            puVar19 = partitions.endings.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start = (unsigned_long)partition_2.partitions;
            markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        puVar12 = markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar25 = partitions.elements.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[sVar35];
        uVar33 = puVar23[sVar35];
        uVar24 = puVar19[uVar33];
        if (uVar24 <= uVar25) {
          lVar8 = *(long *)(partitions.sets + uVar24 * 8);
          *(long *)(partitions.sets + uVar25 * 8) = lVar8;
          partitions.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[lVar8] = uVar25;
          *(size_t *)(partitions.sets + uVar24 * 8) = sVar35;
          partitions.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[sVar35] = uVar24;
          puVar19[uVar33] = puVar19[uVar33] + 1;
        }
        lVar41 = lVar41 + 8;
        psVar6 = psStack_68;
      } while (uVar32 << 3 != lVar41);
      for (; psVar6 != puVar12; psVar6 = psVar6 + 1) {
        pPVar30 = (Partitions *)*psVar6;
        auStack_98 = (undefined1  [8])&splitter.index;
        partition_2.partitions = pPVar30;
        pPVar18 = (Partitions *)anon_unknown_0::Partitions::Set::split((Set *)auStack_98);
        if (pPVar18 != (Partitions *)0x0) {
          if (partitions.beginnings.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar18] -
              partitions.setIndices.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar18] <
              partitions.beginnings.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar30] -
              partitions.setIndices.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar30]) {
            pPVar18 = pPVar30;
          }
          auStack_98 = (undefined1  [8])0x0;
          partition_2.partitions = (Partitions *)0x0;
          partition_2.index = 0;
          if (partitions.setIndices.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar18] !=
              partitions.beginnings.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar18]) {
            plVar2 = (long *)(partitions.sets +
                             partitions.beginnings.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage[(long)pPVar18] * 8);
            plVar38 = (long *)(partitions.sets +
                              partitions.setIndices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage[(long)pPVar18] * 8);
            do {
              uVar25 = *(ulong *)((long)auStack_b8 + *plVar38 * 8);
              uVar24 = *(ulong *)((long)auStack_b8 + (*plVar38 + 1) * 8);
              puVar23 = splitters.elementIndices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              puVar19 = splitters.endings.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              if (uVar25 < uVar24) {
                do {
                  splitter.partitions = (Partitions *)puVar23[uVar25];
                  local_250 = (undefined1  [8])this;
                  if (puVar19[(long)splitter.partitions] ==
                      splitters.setIndices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[(long)splitter.partitions]) {
                    if (partition_2.partitions == (Partitions *)partition_2.index) {
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_98,
                                 (iterator)partition_2.partitions,(unsigned_long *)&splitter);
                      puVar23 = splitters.elementIndices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
                      puVar19 = splitters.endings.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
                    }
                    else {
                      (partition_2.partitions)->sets = (size_t)splitter.partitions;
                      partition_2.partitions = (Partitions *)&(partition_2.partitions)->elements;
                    }
                  }
                  uVar9 = splitters.elements.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage[uVar25];
                  uVar32 = puVar23[uVar25];
                  uVar10 = puVar19[uVar32];
                  if (uVar10 <= uVar9) {
                    lVar41 = CONCAT44(splitters.sets._4_4_,(undefined4)splitters.sets);
                    lVar26 = *(long *)(lVar41 + uVar10 * 8);
                    *(long *)(lVar41 + uVar9 * 8) = lVar26;
                    splitters.elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[lVar26] = uVar9;
                    *(ulong *)(lVar41 + uVar10 * 8) = uVar25;
                    splitters.elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[uVar25] = uVar10;
                    puVar19[uVar32] = puVar19[uVar32] + 1;
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar24 != uVar25);
              }
              pPVar30 = partition_2.partitions;
              plVar38 = plVar38 + 1;
            } while (plVar38 != plVar2);
            for (auVar39 = auStack_98; auVar39 != (undefined1  [8])pPVar30;
                auVar39 = (undefined1  [8])&((Partitions *)auVar39)->elements) {
              splitter.partitions = (Partitions *)((Partitions *)auVar39)->sets;
              local_250 = (undefined1  [8])this;
              local_260 = anon_unknown_0::Partitions::Set::split((Set *)local_250);
              if (local_260 != 0) {
                if (potentialSplitters.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    potentialSplitters.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                             &resultPartitions,
                             (iterator)
                             potentialSplitters.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start,&local_260);
                }
                else {
                  *potentialSplitters.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start = local_260;
                  potentialSplitters.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       potentialSplitters.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                }
              }
            }
            if (auStack_98 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_98,partition_2.index - (long)auStack_98);
            }
          }
        }
      }
      if (psStack_68 != (size_t *)0x0) {
        operator_delete(psStack_68,
                        (long)markedPartitions.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)psStack_68);
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::reserve(__return_storage_ptr__,splitter.index);
  if (splitter.index != 0) {
    uVar25 = 0;
    do {
      psStack_68 = (size_t *)0x0;
      markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&psStack_68,
                 partitions.beginnings.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[uVar25] -
                 partitions.setIndices.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[uVar25]);
      sVar35 = partitions.sets;
      uVar32 = partitions.beginnings.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[uVar25];
      if (partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[uVar25] != uVar32) {
        lVar26 = partitions.setIndices.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[uVar25] << 3;
        do {
          auStack_98 = *(undefined1 (*) [8])(sVar35 + lVar26);
          if (markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&psStack_68,
                       (iterator)
                       markedPartitions.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,(unsigned_long *)auStack_98);
          }
          else {
            *markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start = (unsigned_long)auStack_98;
            markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
          lVar26 = lVar26 + 8;
        } while (uVar32 << 3 != lVar26);
      }
      std::
      vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  *)__return_storage_ptr__,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&psStack_68);
      if (psStack_68 != (size_t *)0x0) {
        operator_delete(psStack_68,
                        (long)markedPartitions.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)psStack_68);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < splitter.index);
  }
  if (resultPartitions !=
      (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       *)0x0) {
    operator_delete(resultPartitions,
                    (long)potentialSplitters.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)resultPartitions);
  }
  if (splitters.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(splitters.endings.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)splitters.pivots.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)splitters.endings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (splitters.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(splitters.beginnings.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)splitters.endings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)splitters.beginnings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (splitters.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(splitters.setIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)splitters.beginnings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)splitters.setIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (splitters.elementIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(splitters.elementIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)splitters.setIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)splitters.elementIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(splitters.elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)splitters.elementIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)splitters.elements.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  pvVar11 = (void *)CONCAT44(splitters.sets._4_4_,(undefined4)splitters.sets);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)splitters.elements.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pvVar11);
  }
  if (auStack_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_b8,
                    (long)transitionIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_b8);
  }
  if (pTVar20 != (pointer)0x0) {
    operator_delete(pTVar20,(long)local_40 - (long)pTVar20);
  }
  if (partitions.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(partitions.endings.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)partitions.pivots.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)partitions.endings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (partitions.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(partitions.beginnings.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)partitions.endings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)partitions.beginnings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(partitions.setIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)partitions.beginnings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)partitions.setIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (partitions.elementIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(partitions.elementIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)partitions.setIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)partitions.elementIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (partitions.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(partitions.elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)partitions.elementIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)partitions.elements.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (partitions.sets != 0) {
    operator_delete((void *)partitions.sets,
                    (long)partitions.elements.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - partitions.sets);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<size_t>>
refinePartitionsImpl(const InputGraph& inputGraph) {
  // Find the number of states and transitions.
  size_t numElements = 0;
  size_t numTransitions = 0;
  for (const auto& partition : inputGraph) {
    numElements += partition.size();
    for (const auto& elem : partition) {
      numTransitions += elem.size();
    }
  }

  // The partitions of DFA states.
  Partitions partitions = initializeStatePartitions(inputGraph, numElements);

  // The transitions arranged such that the transitions leading to state `q` are
  // `transitions[transitionIndices[q] : transitionIndices[q+1]]`.
  std::vector<Transition> transitions;
  std::vector<size_t> transitionIndices;
  initializeTransitions(
    inputGraph, numElements, numTransitions, transitions, transitionIndices);

  // The splitters, which are partitions of the input transitions.
  Partitions splitters =
    initializeSplitterPartitions(partitions, transitions, transitionIndices);

  // The list of splitter partitions that might be able to split states in some
  // state partition. Starts out containing all splitter partitions.
  std::vector<size_t> potentialSplitters;
  potentialSplitters.reserve(splitters.sets);
  for (size_t i = 0; i < splitters.sets; ++i) {
    potentialSplitters.push_back(i);
  }

  while (!potentialSplitters.empty()) {
    size_t potentialSplitter = potentialSplitters.back();
    potentialSplitters.pop_back();

    // The partitions that may be able to be split.
    std::vector<size_t> markedPartitions;

    // Mark states that are predecessors via this splitter partition.
    for (size_t transition : splitters.getSet(potentialSplitter)) {
      size_t state = transitions[transition].pred;
      auto partition = partitions.getSetForElem(state);
      if (!partition.hasMarks()) {
        markedPartitions.push_back(partition.index);
      }
      partitions.mark(state);
    }

    // Try to split each partition with marked states.
    for (size_t partition : markedPartitions) {
      size_t newPartition = partitions.getSet(partition).split();
      if (!newPartition) {
        // There was nothing to split.
        continue;
      }

      // We only want to keep using the smaller of the two split partitions.
      if (partitions.getSet(newPartition).size() <
          partitions.getSet(partition).size()) {
        newPartition = partition;
      }

      // The splitter partitions that may need to be split to match the new
      // split of the state partitions.
      std::vector<size_t> markedSplitters;

      // Mark transitions that lead to the newly split off states.
      for (size_t state : partitions.getSet(newPartition)) {
        for (size_t t = transitionIndices[state],
                    end = transitionIndices[state + 1];
             t < end;
             ++t) {
          auto splitter = splitters.getSetForElem(t);
          if (!splitter.hasMarks()) {
            markedSplitters.push_back(splitter.index);
          }
          splitters.mark(t);
        }
      }

      // Split the splitters and update `potentialSplitters`.
      for (size_t splitter : markedSplitters) {
        size_t newSplitter = splitters.getSet(splitter).split();
        if (newSplitter) {
          potentialSplitters.push_back(newSplitter);
        }
      }
    }
  }

  // Return the refined partitions.
  std::vector<std::vector<size_t>> resultPartitions;
  resultPartitions.reserve(partitions.sets);
  for (size_t p = 0; p < partitions.sets; ++p) {
    auto partition = partitions.getSet(p);
    std::vector<size_t> resultPartition;
    resultPartition.reserve(partition.size());
    for (size_t elem : partition) {
      resultPartition.push_back(elem);
    }
    resultPartitions.emplace_back(std::move(resultPartition));
  }
  return resultPartitions;
}